

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O1

size_t absl::lts_20240722::cord_internal::GetEstimatedFairShareMemoryUsage
                 (Nonnull<const_CordRep_*> rep)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Nonnull<const_CordRep_*> pCVar4;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> *in_RDX;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> rep_01;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> raw_usage;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0> local_8;
  
  local_8.total = 0.0;
  iVar2 = (rep->refcount).count_.super___atomic_base<int>._M_i;
  iVar3 = iVar2 >> 1;
  auVar6._8_4_ = iVar2 >> 0x1f;
  auVar6._0_8_ = (long)iVar3;
  auVar6._12_4_ = 0x45300000;
  dVar5 = 1.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0));
  if (rep->tag == '\x02') {
    local_8.total = dVar5 * 32.0 + 0.0;
    rep = (Nonnull<const_CordRep_*>)rep[1].length;
    if (rep == (Nonnull<const_CordRep_*>)0x0) goto LAB_00115788;
    iVar2 = (rep->refcount).count_.super___atomic_base<int>._M_i;
    iVar3 = iVar2 >> 1;
    auVar7._8_4_ = iVar2 >> 0x1f;
    auVar7._0_8_ = (long)iVar3;
    auVar7._12_4_ = 0x45300000;
    dVar5 = dVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0));
  }
  if (rep == (Nonnull<const_CordRep_*>)0x0) {
    __assert_fail("edge != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                  ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
  }
  bVar1 = rep->tag;
  if (bVar1 < 5) {
    pCVar4 = rep;
    if (bVar1 == 1) {
      pCVar4 = *(Nonnull<const_CordRep_*> *)&rep[1].refcount;
    }
    if (pCVar4->tag < 5) {
      if (bVar1 != 3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord_analysis.cc"
                      ,0xae,
                      "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
                     );
      }
      rep_01.fraction = dVar5;
      rep_01.rep = rep;
      anon_unknown_0::
      AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
                (rep_01,&stack0xfffffffffffffff8);
      goto LAB_00115788;
    }
  }
  rep_00.fraction = dVar5;
  rep_00.rep = (Nonnull<const_CordRep_*>)&stack0xfffffffffffffff8;
  anon_unknown_0::AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)0>
            ((anon_unknown_0 *)rep,rep_00,in_RDX);
LAB_00115788:
  return (long)(local_8.total - 9.223372036854776e+18) & (long)local_8.total >> 0x3f |
         (long)local_8.total;
}

Assistant:

size_t GetEstimatedFairShareMemoryUsage(absl::Nonnull<const CordRep*> rep) {
  return GetEstimatedUsage<Mode::kFairShare>(rep);
}